

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void suboption(connectdata *conn)

{
  char cVar1;
  Curl_easy *data;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  uint *puVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  ulong length;
  ulong uVar9;
  char *pcVar10;
  char varval [128];
  char varname [128];
  uchar temp [2048];
  
  varname[0x70] = '\0';
  varname[0x71] = '\0';
  varname[0x72] = '\0';
  varname[0x73] = '\0';
  varname[0x74] = '\0';
  varname[0x75] = '\0';
  varname[0x76] = '\0';
  varname[0x77] = '\0';
  varname[0x78] = '\0';
  varname[0x79] = '\0';
  varname[0x7a] = '\0';
  varname[0x7b] = '\0';
  varname[0x7c] = '\0';
  varname[0x7d] = '\0';
  varname[0x7e] = '\0';
  varname[0x7f] = '\0';
  varname[0x60] = '\0';
  varname[0x61] = '\0';
  varname[0x62] = '\0';
  varname[99] = '\0';
  varname[100] = '\0';
  varname[0x65] = '\0';
  varname[0x66] = '\0';
  varname[0x67] = '\0';
  varname[0x68] = '\0';
  varname[0x69] = '\0';
  varname[0x6a] = '\0';
  varname[0x6b] = '\0';
  varname[0x6c] = '\0';
  varname[0x6d] = '\0';
  varname[0x6e] = '\0';
  varname[0x6f] = '\0';
  varname[0x50] = '\0';
  varname[0x51] = '\0';
  varname[0x52] = '\0';
  varname[0x53] = '\0';
  varname[0x54] = '\0';
  varname[0x55] = '\0';
  varname[0x56] = '\0';
  varname[0x57] = '\0';
  varname[0x58] = '\0';
  varname[0x59] = '\0';
  varname[0x5a] = '\0';
  varname[0x5b] = '\0';
  varname[0x5c] = '\0';
  varname[0x5d] = '\0';
  varname[0x5e] = '\0';
  varname[0x5f] = '\0';
  varname[0x40] = '\0';
  varname[0x41] = '\0';
  varname[0x42] = '\0';
  varname[0x43] = '\0';
  varname[0x44] = '\0';
  varname[0x45] = '\0';
  varname[0x46] = '\0';
  varname[0x47] = '\0';
  varname[0x48] = '\0';
  varname[0x49] = '\0';
  varname[0x4a] = '\0';
  varname[0x4b] = '\0';
  varname[0x4c] = '\0';
  varname[0x4d] = '\0';
  varname[0x4e] = '\0';
  varname[0x4f] = '\0';
  varname[0x30] = '\0';
  varname[0x31] = '\0';
  varname[0x32] = '\0';
  varname[0x33] = '\0';
  varname[0x34] = '\0';
  varname[0x35] = '\0';
  varname[0x36] = '\0';
  varname[0x37] = '\0';
  varname[0x38] = '\0';
  varname[0x39] = '\0';
  varname[0x3a] = '\0';
  varname[0x3b] = '\0';
  varname[0x3c] = '\0';
  varname[0x3d] = '\0';
  varname[0x3e] = '\0';
  varname[0x3f] = '\0';
  varname[0x20] = '\0';
  varname[0x21] = '\0';
  varname[0x22] = '\0';
  varname[0x23] = '\0';
  varname[0x24] = '\0';
  varname[0x25] = '\0';
  varname[0x26] = '\0';
  varname[0x27] = '\0';
  varname[0x28] = '\0';
  varname[0x29] = '\0';
  varname[0x2a] = '\0';
  varname[0x2b] = '\0';
  varname[0x2c] = '\0';
  varname[0x2d] = '\0';
  varname[0x2e] = '\0';
  varname[0x2f] = '\0';
  varname[0x10] = '\0';
  varname[0x11] = '\0';
  varname[0x12] = '\0';
  varname[0x13] = '\0';
  varname[0x14] = '\0';
  varname[0x15] = '\0';
  varname[0x16] = '\0';
  varname[0x17] = '\0';
  varname[0x18] = '\0';
  varname[0x19] = '\0';
  varname[0x1a] = '\0';
  varname[0x1b] = '\0';
  varname[0x1c] = '\0';
  varname[0x1d] = '\0';
  varname[0x1e] = '\0';
  varname[0x1f] = '\0';
  varname[0] = '\0';
  varname[1] = '\0';
  varname[2] = '\0';
  varname[3] = '\0';
  varname[4] = '\0';
  varname[5] = '\0';
  varname[6] = '\0';
  varname[7] = '\0';
  varname[8] = '\0';
  varname[9] = '\0';
  varname[10] = '\0';
  varname[0xb] = '\0';
  varname[0xc] = '\0';
  varname[0xd] = '\0';
  varname[0xe] = '\0';
  varname[0xf] = '\0';
  varval[0x70] = '\0';
  varval[0x71] = '\0';
  varval[0x72] = '\0';
  varval[0x73] = '\0';
  varval[0x74] = '\0';
  varval[0x75] = '\0';
  varval[0x76] = '\0';
  varval[0x77] = '\0';
  varval[0x78] = '\0';
  varval[0x79] = '\0';
  varval[0x7a] = '\0';
  varval[0x7b] = '\0';
  varval[0x7c] = '\0';
  varval[0x7d] = '\0';
  varval[0x7e] = '\0';
  varval[0x7f] = '\0';
  varval[0x60] = '\0';
  varval[0x61] = '\0';
  varval[0x62] = '\0';
  varval[99] = '\0';
  varval[100] = '\0';
  varval[0x65] = '\0';
  varval[0x66] = '\0';
  varval[0x67] = '\0';
  varval[0x68] = '\0';
  varval[0x69] = '\0';
  varval[0x6a] = '\0';
  varval[0x6b] = '\0';
  varval[0x6c] = '\0';
  varval[0x6d] = '\0';
  varval[0x6e] = '\0';
  varval[0x6f] = '\0';
  varval[0x50] = '\0';
  varval[0x51] = '\0';
  varval[0x52] = '\0';
  varval[0x53] = '\0';
  varval[0x54] = '\0';
  varval[0x55] = '\0';
  varval[0x56] = '\0';
  varval[0x57] = '\0';
  varval[0x58] = '\0';
  varval[0x59] = '\0';
  varval[0x5a] = '\0';
  varval[0x5b] = '\0';
  varval[0x5c] = '\0';
  varval[0x5d] = '\0';
  varval[0x5e] = '\0';
  varval[0x5f] = '\0';
  varval[0x40] = '\0';
  varval[0x41] = '\0';
  varval[0x42] = '\0';
  varval[0x43] = '\0';
  varval[0x44] = '\0';
  varval[0x45] = '\0';
  varval[0x46] = '\0';
  varval[0x47] = '\0';
  varval[0x48] = '\0';
  varval[0x49] = '\0';
  varval[0x4a] = '\0';
  varval[0x4b] = '\0';
  varval[0x4c] = '\0';
  varval[0x4d] = '\0';
  varval[0x4e] = '\0';
  varval[0x4f] = '\0';
  varval[0x30] = '\0';
  varval[0x31] = '\0';
  varval[0x32] = '\0';
  varval[0x33] = '\0';
  varval[0x34] = '\0';
  varval[0x35] = '\0';
  varval[0x36] = '\0';
  varval[0x37] = '\0';
  varval[0x38] = '\0';
  varval[0x39] = '\0';
  varval[0x3a] = '\0';
  varval[0x3b] = '\0';
  varval[0x3c] = '\0';
  varval[0x3d] = '\0';
  varval[0x3e] = '\0';
  varval[0x3f] = '\0';
  varval[0x20] = '\0';
  varval[0x21] = '\0';
  varval[0x22] = '\0';
  varval[0x23] = '\0';
  varval[0x24] = '\0';
  varval[0x25] = '\0';
  varval[0x26] = '\0';
  varval[0x27] = '\0';
  varval[0x28] = '\0';
  varval[0x29] = '\0';
  varval[0x2a] = '\0';
  varval[0x2b] = '\0';
  varval[0x2c] = '\0';
  varval[0x2d] = '\0';
  varval[0x2e] = '\0';
  varval[0x2f] = '\0';
  varval[0x10] = '\0';
  varval[0x11] = '\0';
  varval[0x12] = '\0';
  varval[0x13] = '\0';
  varval[0x14] = '\0';
  varval[0x15] = '\0';
  varval[0x16] = '\0';
  varval[0x17] = '\0';
  varval[0x18] = '\0';
  varval[0x19] = '\0';
  varval[0x1a] = '\0';
  varval[0x1b] = '\0';
  varval[0x1c] = '\0';
  varval[0x1d] = '\0';
  varval[0x1e] = '\0';
  varval[0x1f] = '\0';
  varval[0] = '\0';
  varval[1] = '\0';
  varval[2] = '\0';
  varval[3] = '\0';
  varval[4] = '\0';
  varval[5] = '\0';
  varval[6] = '\0';
  varval[7] = '\0';
  varval[8] = '\0';
  varval[9] = '\0';
  varval[10] = '\0';
  varval[0xb] = '\0';
  varval[0xc] = '\0';
  varval[0xd] = '\0';
  varval[0xe] = '\0';
  varval[0xf] = '\0';
  data = conn->data;
  pvVar2 = (data->req).protop;
  printsub(data,0x3c,(uchar *)((long)pvVar2 + 0x1cb8),
           (*(long *)((long)pvVar2 + 0x1ec0) - *(long *)((long)pvVar2 + 0x1eb8)) + 2);
  pcVar10 = *(char **)((long)pvVar2 + 0x1eb8);
  *(char **)((long)pvVar2 + 0x1eb8) = pcVar10 + 1;
  cVar1 = *pcVar10;
  if (cVar1 == '\'') {
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c",0xff,0xfa,0x27,0);
    puVar7 = *(undefined8 **)((long)pvVar2 + 0x1cb0);
    if (puVar7 == (undefined8 *)0x0) {
      length = 4;
    }
    else {
      length = 4;
      do {
        pcVar10 = (char *)*puVar7;
        sVar4 = strlen(pcVar10);
        uVar9 = length + sVar4 + 1;
        if ((uVar9 < 0x7fa) &&
           (iVar3 = __isoc99_sscanf(pcVar10,"%127[^,],%127s",varname,varval), iVar3 != 0)) {
          curl_msnprintf((char *)(temp + length),0x800 - length,"%c%s%c%s",0,varname,1,varval);
          length = uVar9;
        }
        puVar7 = (undefined8 *)puVar7[1];
      } while (puVar7 != (undefined8 *)0x0);
    }
    curl_msnprintf((char *)(temp + length),0x800 - length,"%c%c",0xff,0xf0);
    sVar5 = send(conn->sock[0],temp,length + 2,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar6);
    }
  }
  else {
    if (cVar1 == '#') {
      pcVar10 = (char *)((long)pvVar2 + 0x1c28);
      sVar4 = strlen(pcVar10);
      uVar8 = 0x23;
    }
    else {
      if (cVar1 != '\x18') {
        return;
      }
      pcVar10 = (char *)((long)pvVar2 + 0x1c08);
      sVar4 = strlen(pcVar10);
      uVar8 = 0x18;
    }
    length = sVar4 + 4;
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,uVar8,0,pcVar10,0xff,0xf0);
    sVar5 = send(conn->sock[0],temp,sVar4 + 6,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar6);
    }
  }
  printsub(data,0x3e,temp + 2,length);
  return;
}

Assistant:

static void suboption(struct connectdata *conn)
{
  struct curl_slist *v;
  unsigned char temp[2048];
  ssize_t bytes_written;
  size_t len;
  int err;
  char varname[128] = "";
  char varval[128] = "";
  struct Curl_easy *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->req.protop;

  printsub(data, '<', (unsigned char *)tn->subbuffer, CURL_SB_LEN(tn) + 2);
  switch(CURL_SB_GET(tn)) {
    case CURL_TELOPT_TTYPE:
      len = strlen(tn->subopt_ttype) + 4 + 2;
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_TTYPE,
               CURL_TELQUAL_IS, tn->subopt_ttype, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_XDISPLOC:
      len = strlen(tn->subopt_xdisploc) + 4 + 2;
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_XDISPLOC,
               CURL_TELQUAL_IS, tn->subopt_xdisploc, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_NEW_ENVIRON:
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_NEW_ENVIRON,
               CURL_TELQUAL_IS);
      len = 4;

      for(v = tn->telnet_vars; v; v = v->next) {
        size_t tmplen = (strlen(v->data) + 1);
        /* Add the variable only if it fits */
        if(len + tmplen < (int)sizeof(temp)-6) {
          if(sscanf(v->data, "%127[^,],%127s", varname, varval)) {
            snprintf((char *)&temp[len], sizeof(temp) - len,
                     "%c%s%c%s", CURL_NEW_ENV_VAR, varname,
                     CURL_NEW_ENV_VALUE, varval);
            len += tmplen;
          }
        }
      }
      snprintf((char *)&temp[len], sizeof(temp) - len,
               "%c%c", CURL_IAC, CURL_SE);
      len += 2;
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
  }
  return;
}